

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::CreateLinkScript
          (cmMakefileTargetGenerator *this,char *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *link_commands,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_commands,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends)

{
  pointer pbVar1;
  ostream *poVar2;
  string *link_command_1;
  pointer pbVar3;
  cmOutputConverter *this_00;
  string_view source;
  string local_380;
  string local_360;
  string linkScriptName;
  string link_command;
  char *name_local;
  cmAlphaNum local_2f8;
  cmAlphaNum local_2c8;
  cmGeneratedFileStream linkScriptStream;
  
  linkScriptStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
  linkScriptStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream = (_func_int **)(this->TargetBuildDirectoryFull)._M_string_length;
  local_2f8.View_._M_str = local_2f8.Digits_;
  local_2f8.View_._M_len = 1;
  local_2f8.Digits_[0] = '/';
  name_local = name;
  cmStrCat<char_const*>(&linkScriptName,(cmAlphaNum *)&linkScriptStream,&local_2f8,&name_local);
  cmGeneratedFileStream::cmGeneratedFileStream(&linkScriptStream,&linkScriptName,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent(&linkScriptStream,true);
  pbVar1 = (link_commands->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (link_commands->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    if ((pbVar3->_M_string_length != 0) && (*(pbVar3->_M_dataplus)._M_p != ':')) {
      poVar2 = std::operator<<((ostream *)&linkScriptStream,(string *)pbVar3);
      std::operator<<(poVar2,"\n");
    }
  }
  local_2f8.View_._M_len = 0x26;
  local_2f8.View_._M_str = "$(CMAKE_COMMAND) -E cmake_link_script ";
  this_00 = &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
             super_cmOutputConverter;
  cmOutputConverter::MaybeRelativeToCurBinDir(&local_380,this_00,&linkScriptName);
  source._M_str = local_380._M_dataplus._M_p;
  source._M_len = local_380._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_360,this_00,source,SHELL);
  local_2c8.View_._M_len = local_360._M_string_length;
  local_2c8.View_._M_str = local_360._M_dataplus._M_p;
  cmStrCat<char[22]>(&link_command,&local_2f8,&local_2c8,(char (*) [22])" --verbose=$(VERBOSE)");
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makefile_commands,
             &link_command);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makefile_depends,
             &linkScriptName);
  std::__cxx11::string::~string((string *)&link_command);
  cmGeneratedFileStream::~cmGeneratedFileStream(&linkScriptStream);
  std::__cxx11::string::~string((string *)&linkScriptName);
  return;
}

Assistant:

void cmMakefileTargetGenerator::CreateLinkScript(
  const char* name, std::vector<std::string> const& link_commands,
  std::vector<std::string>& makefile_commands,
  std::vector<std::string>& makefile_depends)
{
  // Create the link script file.
  std::string linkScriptName =
    cmStrCat(this->TargetBuildDirectoryFull, '/', name);
  cmGeneratedFileStream linkScriptStream(linkScriptName);
  linkScriptStream.SetCopyIfDifferent(true);
  for (std::string const& link_command : link_commands) {
    // Do not write out empty commands or commands beginning in the
    // shell no-op ":".
    if (!link_command.empty() && link_command[0] != ':') {
      linkScriptStream << link_command << "\n";
    }
  }

  // Create the makefile command to invoke the link script.
  std::string link_command =
    cmStrCat("$(CMAKE_COMMAND) -E cmake_link_script ",
             this->LocalGenerator->ConvertToOutputFormat(
               this->LocalGenerator->MaybeRelativeToCurBinDir(linkScriptName),
               cmOutputConverter::SHELL),
             " --verbose=$(VERBOSE)");
  makefile_commands.push_back(std::move(link_command));
  makefile_depends.push_back(std::move(linkScriptName));
}